

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMBaseInfo.h
# Opt level: O2

char * ARMCC_ARMCondCodeToString(ARMCC_CondCodes CC)

{
  if (CC < (ARMCC_AL|ARMCC_NE)) {
    return &DAT_001d4218 + *(int *)(&DAT_001d4218 + (ulong)CC * 4);
  }
  return anon_var_dwarf_e328e + 0x11;
}

Assistant:

inline static char *ARMCC_ARMCondCodeToString(ARMCC_CondCodes CC)
{
	switch (CC) {
		case ARMCC_EQ:  return "eq";
		case ARMCC_NE:  return "ne";
		case ARMCC_HS:  return "hs";
		case ARMCC_LO:  return "lo";
		case ARMCC_MI:  return "mi";
		case ARMCC_PL:  return "pl";
		case ARMCC_VS:  return "vs";
		case ARMCC_VC:  return "vc";
		case ARMCC_HI:  return "hi";
		case ARMCC_LS:  return "ls";
		case ARMCC_GE:  return "ge";
		case ARMCC_LT:  return "lt";
		case ARMCC_GT:  return "gt";
		case ARMCC_LE:  return "le";
		case ARMCC_AL:  return "al";
		default: return "";
	}
}